

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero-delay-observer.cpp
# Opt level: O3

void __thiscall
stateObservation::ZeroDelayObserver::setState(ZeroDelayObserver *this,StateVector *x_k,TimeIndex k)

{
  Matrix<double,__1,_1,_0,__1,_1> *this_00;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong size_00;
  double *pdVar4;
  _Map_pointer ppMVar5;
  double dVar6;
  int iVar7;
  undefined4 extraout_var;
  Index index;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  Index size;
  
  iVar7 = (*(this->super_ObserverBase)._vptr_ObserverBase[0x14])();
  if ((char)iVar7 == '\0') {
    __assert_fail("checkStateVector(x_k) && \"The size of the state vector is incorrect\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                  ,8,
                  "virtual void stateObservation::ZeroDelayObserver::setState(const ObserverBase::StateVector &, TimeIndex)"
                 );
  }
  (this->x_).super_DebugItem<bool,_stateObservation::DebugItemDefaultValue<bool,_true>,_true>.b_ =
       true;
  (this->x_).k_ = k;
  this_00 = &(this->x_).v_;
  pdVar3 = (x_k->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  size_00 = (x_k->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((this->x_).v_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != size_00) {
    if ((long)size_00 < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)this_00,size_00,size_00,1);
    if ((this->x_).v_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != size_00) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                   );
    }
  }
  pdVar4 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  uVar8 = size_00 - ((long)size_00 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)size_00) {
    lVar10 = 0;
    do {
      pdVar2 = pdVar3 + lVar10;
      dVar6 = pdVar2[1];
      pdVar1 = pdVar4 + lVar10;
      *pdVar1 = *pdVar2;
      pdVar1[1] = dVar6;
      lVar10 = lVar10 + 2;
    } while (lVar10 < (long)uVar8);
  }
  if ((long)uVar8 < (long)size_00) {
    do {
      pdVar4[uVar8] = pdVar3[uVar8];
      uVar8 = uVar8 + 1;
    } while (size_00 != uVar8);
  }
  iVar7 = (*(this->super_ObserverBase)._vptr_ObserverBase[0x22])(this);
  if (k < CONCAT44(extraout_var,iVar7)) {
    ppMVar5 = (this->y_).v_.
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    (this->y_).k_ =
         ((long)(this->y_).v_.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur -
          (long)(this->y_).v_.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) + (this->y_).k_ +
         ((long)(this->y_).v_.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last -
          (long)(this->y_).v_.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
         ((((ulong)((long)ppMVar5 -
                   (long)(this->y_).v_.
                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
         (ulong)(ppMVar5 == (_Map_pointer)0x0)) * 0x20;
    std::
    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::clear(&(this->y_).v_);
    ppMVar5 = (this->u_).v_.
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    (this->u_).k_ =
         ((long)(this->u_).v_.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur -
          (long)(this->u_).v_.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) + (this->u_).k_ +
         ((long)(this->u_).v_.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last -
          (long)(this->u_).v_.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
         ((((ulong)((long)ppMVar5 -
                   (long)(this->u_).v_.
                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
         (ulong)(ppMVar5 == (_Map_pointer)0x0)) * 0x20;
    std::
    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::clear(&(this->u_).v_);
    return;
  }
  lVar10 = (this->y_).k_;
  while( true ) {
    ppMVar5 = (this->y_).v_.
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    lVar9 = ((long)(this->y_).v_.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur -
             (long)(this->y_).v_.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
            ((((ulong)((long)ppMVar5 -
                      (long)(this->y_).v_.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (ulong)(ppMVar5 == (_Map_pointer)0x0)) * 0x20;
    lVar11 = (long)(this->y_).v_.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_last -
             (long)(this->y_).v_.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4;
    if ((lVar11 + lVar9 < 1) || (k < lVar10)) break;
    if (lVar11 + lVar9 == 0) goto LAB_0013e460;
    std::
    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::pop_front(&(this->y_).v_);
    lVar10 = (this->y_).k_ + 1;
    (this->y_).k_ = lVar10;
  }
  if (0 < (this->super_ObserverBase).p_) {
    lVar10 = (this->u_).k_;
    while( true ) {
      ppMVar5 = (this->u_).v_.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      lVar9 = ((long)(this->u_).v_.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)(this->u_).v_.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
              ((((ulong)((long)ppMVar5 -
                        (long)(this->u_).v_.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
              (ulong)(ppMVar5 == (_Map_pointer)0x0)) * 0x20;
      lVar11 = (long)(this->u_).v_.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_last -
               (long)(this->u_).v_.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4;
      if ((lVar11 + lVar9 < 1) || (k <= lVar10)) break;
      if (lVar11 + lVar9 == 0) {
LAB_0013e460:
        __assert_fail("v_.size() && \"Error: Matrix array is empty\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                      ,0x19a,
                      "void stateObservation::IndexedMatrixArrayT<Eigen::Matrix<double, -1, 1>>::check_() const [MatrixType = Eigen::Matrix<double, -1, 1>, Allocator = std::allocator<Eigen::Matrix<double, -1, 1>>]"
                     );
      }
      std::
      deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::pop_front(&(this->u_).v_);
      lVar10 = (this->u_).k_ + 1;
      (this->u_).k_ = lVar10;
    }
  }
  return;
}

Assistant:

void ZeroDelayObserver::setState(const ObserverBase::StateVector & x_k, TimeIndex k)
{
  BOOST_ASSERT(checkStateVector(x_k) && "The size of the state vector is incorrect");

  x_.set(x_k, k);

  if(k < getCurrentTime())
  {
    y_.clear();
    u_.clear();
  }
  else
  {
    while(y_.size() > 0 && y_.getFirstIndex() <= k)
    {
      y_.popFront();
    }

    if(p_ > 0)
      while(u_.size() > 0 && u_.getFirstIndex() < k)
      {
        u_.popFront();
      }
  }
}